

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O3

int CfdFinalizeMultisigSign
              (void *handle,void *multisign_handle,int net_type,char *tx_hex_string,char *txid,
              uint32_t vout,int hash_type,char *redeem_script,char **tx_string)

{
  pointer pcVar1;
  uint32_t vout_00;
  bool bVar2;
  AddressType AVar3;
  size_t sVar4;
  CfdException *pCVar5;
  char *pcVar6;
  char *__s;
  ulong uVar7;
  bool is_bitcoin;
  SignParameter param;
  OutPoint outpoint;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> sign_list;
  Script witness_script_obj;
  Script redeem_script_obj;
  allocator local_22a;
  bool local_229;
  void *local_228;
  Script local_220;
  void *local_1e8;
  string local_1e0;
  uint32_t local_1bc;
  AddressType local_1b8;
  int local_1b4;
  undefined1 local_1b0 [104];
  char local_148 [80];
  OutPoint local_f8;
  char *local_d0;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> local_c8;
  char *local_a8;
  Script local_a0;
  Script local_68;
  
  local_1e8 = multisign_handle;
  local_1b4 = net_type;
  local_d0 = txid;
  cfd::Initialize();
  pcVar1 = local_1b0 + 0x10;
  local_1b0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"MultisigSign","");
  cfd::capi::CheckBuffer(local_1e8,(string *)local_1b0);
  if ((pointer)local_1b0._0_8_ != pcVar1) {
    operator_delete((void *)local_1b0._0_8_);
  }
  bVar2 = cfd::capi::IsEmptyString(tx_hex_string);
  if (bVar2) {
    local_1b0._0_8_ = "cfdcapi_transaction.cpp";
    local_1b0._8_4_ = 2000;
    local_1b0._16_8_ = "CfdFinalizeMultisigSign";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_1b0,kCfdLogLevelWarning,"tx is null or empty.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1b0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"Failed to parameter. tx is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_1b0);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar2 = cfd::capi::IsEmptyString(local_d0);
  if (bVar2) {
    local_1b0._0_8_ = "cfdcapi_transaction.cpp";
    local_1b0._8_4_ = 0x7d6;
    local_1b0._16_8_ = "CfdFinalizeMultisigSign";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_1b0,kCfdLogLevelWarning,"txid is null or empty.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1b0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"Failed to parameter. txid is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_1b0);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar2 = cfd::capi::IsEmptyString(redeem_script);
  if (bVar2) {
    local_1b0._0_8_ = "cfdcapi_transaction.cpp";
    local_1b0._8_4_ = 0x7dc;
    local_1b0._16_8_ = "CfdFinalizeMultisigSign";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_1b0,kCfdLogLevelWarning,"redeemScript is null or empty.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1b0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"Failed to parameter. redeemScript is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_1b0);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (tx_string == (char **)0x0) {
    local_1b0._0_8_ = "cfdcapi_transaction.cpp";
    local_1b0._8_4_ = 0x7e2;
    local_1b0._16_8_ = "CfdFinalizeMultisigSign";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_1b0,kCfdLogLevelWarning,"tx output is null.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1b0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"Failed to parameter. tx output is null.","");
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_1b0);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  AVar3 = cfd::capi::ConvertHashToAddressType(0);
  cfd::core::Script::Script(&local_a0);
  cfd::core::Script::Script(&local_68);
  if (AVar3 == kP2shAddress) {
    std::__cxx11::string::string((string *)&local_220,redeem_script,(allocator *)&local_f8);
    cfd::core::Script::Script((Script *)local_1b0,(string *)&local_220);
    cfd::core::Script::operator=(&local_68,(Script *)local_1b0);
  }
  else {
    if (AVar3 != kP2wshAddress) {
      if (AVar3 != kP2shP2wshAddress) {
        local_1b0._0_8_ = "cfdcapi_transaction.cpp";
        local_1b0._8_4_ = 0x7f8;
        local_1b0._16_8_ = "CfdFinalizeMultisigSign";
        cfd::core::logger::log<>
                  ((CfdSourceLocation *)local_1b0,kCfdLogLevelWarning,"pkh is not target.");
        pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
        local_1b0._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1b0,"Failed to parameter. hash type cannot used pkh target.","");
        cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_1b0);
        __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException
                   );
      }
      std::__cxx11::string::string((string *)&local_220,redeem_script,(allocator *)&local_f8);
      cfd::core::Script::Script((Script *)local_1b0,(string *)&local_220);
      cfd::core::Script::operator=(&local_a0,(Script *)local_1b0);
      cfd::core::Script::~Script((Script *)local_1b0);
      if (local_220._vptr_Script !=
          (_func_int **)
          ((long)&local_220.script_data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data + 8U)) {
        operator_delete(local_220._vptr_Script);
      }
      cfd::core::ScriptUtil::CreateP2shLockingScript((Script *)local_1b0,&local_a0);
      cfd::core::Script::operator=(&local_68,(Script *)local_1b0);
      cfd::core::Script::~Script((Script *)local_1b0);
      goto LAB_0042c77a;
    }
    std::__cxx11::string::string((string *)&local_220,redeem_script,(allocator *)&local_f8);
    cfd::core::Script::Script((Script *)local_1b0,(string *)&local_220);
    cfd::core::Script::operator=(&local_a0,(Script *)local_1b0);
  }
  cfd::core::Script::~Script((Script *)local_1b0);
  if (local_220._vptr_Script !=
      (_func_int **)
      ((long)&local_220.script_data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data + 8U)) {
    operator_delete(local_220._vptr_Script);
  }
LAB_0042c77a:
  if (*(uint *)((long)local_1e8 + 0x15c8) == 0) {
    local_1b0._0_8_ = "cfdcapi_transaction.cpp";
    local_1b0._8_4_ = 0x801;
    local_1b0._16_8_ = "CfdFinalizeMultisigSign";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_1b0,kCfdLogLevelWarning,"The signature has empty.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1b0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"The signature has empty.","");
    cfd::core::CfdException::CfdException(pCVar5,kCfdOutOfRangeError,(string *)local_1b0);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_228 = handle;
  local_1bc = vout;
  local_1b8 = AVar3;
  local_a8 = tx_hex_string;
  if (*(uint *)((long)local_1e8 + 0x15c8) < 0x15) {
    local_c8.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pcVar6 = (char *)((long)local_1e8 + 0x10);
    __s = (char *)((long)local_1e8 + 0xb8c);
    uVar7 = 0;
    do {
      local_220._vptr_Script =
           (_func_int **)
           ((long)&local_220.script_data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data + 8);
      sVar4 = strlen(pcVar6);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,pcVar6,pcVar6 + sVar4);
      cfd::core::ByteData::ByteData((ByteData *)&local_f8,(string *)&local_220);
      cfd::SignParameter::SignParameter((SignParameter *)local_1b0,(ByteData *)&local_f8);
      if (local_f8.txid_._vptr_Txid != (_func_int **)0x0) {
        operator_delete(local_f8.txid_._vptr_Txid);
      }
      if (local_220._vptr_Script !=
          (_func_int **)
          ((long)&local_220.script_data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data + 8U)) {
        operator_delete(local_220._vptr_Script);
      }
      local_220._vptr_Script =
           (_func_int **)
           ((long)&local_220.script_data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data + 8);
      sVar4 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,__s,__s + sVar4);
      cfd::core::ByteData::ByteData((ByteData *)&local_f8,(string *)&local_220);
      bVar2 = cfd::core::Pubkey::IsValid((ByteData *)&local_f8);
      if (local_f8.txid_._vptr_Txid != (_func_int **)0x0) {
        operator_delete(local_f8.txid_._vptr_Txid);
      }
      if (bVar2) {
        cfd::core::Pubkey::Pubkey((Pubkey *)&local_f8,(string *)&local_220);
        cfd::SignParameter::SetRelatedPubkey((SignParameter *)local_1b0,(Pubkey *)&local_f8);
        if (local_f8.txid_._vptr_Txid != (_func_int **)0x0) {
          operator_delete(local_f8.txid_._vptr_Txid);
        }
      }
      std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::push_back
                (&local_c8,(value_type *)local_1b0);
      if (local_220._vptr_Script !=
          (_func_int **)
          ((long)&local_220.script_data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data + 8U)) {
        operator_delete(local_220._vptr_Script);
      }
      local_1b0._72_8_ = &PTR__ScriptOperator_00722da0;
      if ((char *)local_1b0._88_8_ != local_148) {
        operator_delete((void *)local_1b0._88_8_);
      }
      if ((pointer)local_1b0._32_8_ != (pointer)0x0) {
        operator_delete((void *)local_1b0._32_8_);
      }
      if ((pointer)local_1b0._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_1b0._0_8_);
      }
      uVar7 = uVar7 + 1;
      pcVar6 = pcVar6 + 0x93;
      __s = __s + 0x83;
    } while (uVar7 < *(uint *)((long)local_1e8 + 0x15c8));
    local_229 = false;
    cfd::capi::ConvertNetType(local_1b4,&local_229);
    std::__cxx11::string::string((string *)&local_220,local_d0,(allocator *)&local_1e0);
    pcVar6 = local_a8;
    AVar3 = local_1b8;
    vout_00 = local_1bc;
    cfd::core::Txid::Txid((Txid *)local_1b0,(string *)&local_220);
    cfd::core::OutPoint::OutPoint(&local_f8,(Txid *)local_1b0,vout_00);
    local_1b0._0_8_ = &PTR__Txid_00723450;
    if ((void *)CONCAT44(local_1b0._12_4_,local_1b0._8_4_) != (void *)0x0) {
      operator_delete((void *)CONCAT44(local_1b0._12_4_,local_1b0._8_4_));
    }
    if (local_220._vptr_Script !=
        (_func_int **)
        ((long)&local_220.script_data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data + 8U)) {
      operator_delete(local_220._vptr_Script);
    }
    std::__cxx11::string::string((string *)local_1b0,redeem_script,(allocator *)&local_1e0);
    cfd::core::Script::Script(&local_220,(string *)local_1b0);
    if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_);
    }
    if (local_229 == true) {
      std::__cxx11::string::string((string *)&local_1e0,pcVar6,&local_22a);
      cfd::TransactionContext::TransactionContext((TransactionContext *)local_1b0,&local_1e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p);
      }
      cfd::TransactionContext::AddMultisigSign
                ((TransactionContext *)local_1b0,&local_f8,&local_c8,&local_220,AVar3);
      cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_1e0,(AbstractTransaction *)local_1b0)
      ;
      pcVar6 = cfd::capi::CreateString(&local_1e0);
      *tx_string = pcVar6;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p);
      }
      cfd::TransactionContext::~TransactionContext((TransactionContext *)local_1b0);
    }
    else {
      std::__cxx11::string::string((string *)&local_1e0,pcVar6,&local_22a);
      cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
                ((ConfidentialTransactionContext *)local_1b0,&local_1e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p);
      }
      cfd::ConfidentialTransactionContext::AddMultisigSign
                ((ConfidentialTransactionContext *)local_1b0,&local_f8,&local_c8,&local_220,AVar3);
      cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_1e0,(AbstractTransaction *)local_1b0)
      ;
      pcVar6 = cfd::capi::CreateString(&local_1e0);
      *tx_string = pcVar6;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p);
      }
      cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
                ((ConfidentialTransactionContext *)local_1b0);
    }
    cfd::core::Script::~Script(&local_220);
    local_f8.txid_._vptr_Txid = (_func_int **)&PTR__Txid_00723450;
    if (local_f8.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f8.txid_.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector(&local_c8);
    cfd::core::Script::~Script(&local_68);
    cfd::core::Script::~Script(&local_a0);
    return 0;
  }
  local_1b0._0_8_ = "cfdcapi_transaction.cpp";
  local_1b0._8_4_ = 0x807;
  local_1b0._16_8_ = "CfdFinalizeMultisigSign";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)local_1b0,kCfdLogLevelWarning,
             "The number of signature has reached the upper limit.");
  pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
  local_1b0._0_8_ = local_1b0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b0,"The number of signature has reached the upper limit.","");
  cfd::core::CfdException::CfdException(pCVar5,kCfdOutOfRangeError,(string *)local_1b0);
  __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdFinalizeMultisigSign(
    void* handle, void* multisign_handle, int net_type,
    const char* tx_hex_string, const char* txid, uint32_t vout, int hash_type,
    const char* redeem_script, char** tx_string) {
  try {
    cfd::Initialize();
    CheckBuffer(multisign_handle, kPrefixMultisigSignData);
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    if (IsEmptyString(redeem_script)) {
      warn(CFD_LOG_SOURCE, "redeemScript is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. redeemScript is null or empty.");
    }
    if (tx_string == nullptr) {
      warn(CFD_LOG_SOURCE, "tx output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx output is null.");
    }

    AddressType addr_type = ConvertHashToAddressType(hash_type);
    Script witness_script_obj;
    Script redeem_script_obj;
    switch (addr_type) {
      case AddressType::kP2shAddress:
        redeem_script_obj = Script(std::string(redeem_script));
        break;
      case AddressType::kP2wshAddress:
        witness_script_obj = Script(std::string(redeem_script));
        break;
      case AddressType::kP2shP2wshAddress:
        witness_script_obj = Script(std::string(redeem_script));
        redeem_script_obj =
            ScriptUtil::CreateP2shLockingScript(witness_script_obj);
        break;
      default:
        warn(CFD_LOG_SOURCE, "pkh is not target.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. hash type cannot used pkh target.");
    }

    CfdCapiMultisigSignData* data =
        static_cast<CfdCapiMultisigSignData*>(multisign_handle);
    if (data->current_index == 0) {
      warn(CFD_LOG_SOURCE, "The signature has empty.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError, "The signature has empty.");
    }
    if (data->current_index > kMultisigMaxKeyNum) {
      warn(
          CFD_LOG_SOURCE,
          "The number of signature has reached the upper limit.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "The number of signature has reached the upper limit.");
    }

    std::vector<SignParameter> sign_list;
    for (uint32_t index = 0; index < data->current_index; ++index) {
      SignParameter param(ByteData(std::string(data->signatures[index])));
      std::string pubkey(data->pubkeys[index]);
      if (Pubkey::IsValid(ByteData(pubkey))) {
        param.SetRelatedPubkey(Pubkey(pubkey));
      }
      sign_list.push_back(param);
    }

    bool is_bitcoin = false;
    ConvertNetType(net_type, &is_bitcoin);
    OutPoint outpoint(Txid(txid), vout);
    Script script = Script(std::string(redeem_script));
    if (is_bitcoin) {
      TransactionContext tx(tx_hex_string);
      tx.AddMultisigSign(outpoint, sign_list, script, addr_type);
      *tx_string = CreateString(tx.GetHex());
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext tx(tx_hex_string);
      tx.AddMultisigSign(outpoint, sign_list, script, addr_type);
      *tx_string = CreateString(tx.GetHex());
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}